

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall BasicBlock::MergePredBlocksValueMaps(BasicBlock *this,GlobOpt *globOpt)

{
  int iVar1;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  JitArenaAllocator *pJVar2;
  PathDependentInfo *pPVar3;
  Loop *pLVar4;
  Type pSVar5;
  Type pFVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  undefined1 auVar8 [8];
  Type pJVar9;
  Type pBVar10;
  code *pcVar11;
  GlobOpt *pGVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint functionId;
  undefined4 *puVar16;
  Type *ppFVar17;
  BailOutInfo *pBVar18;
  Value *pVVar19;
  GlobOptBlockData *pGVar20;
  StackSym *pSVar21;
  ValueInfo *pVVar22;
  Loop *pLVar23;
  StackSym *pSVar24;
  Type_conflict pBVar25;
  BasicBlock *pBVar26;
  Type *ppFVar27;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  BasicBlock *toBlockContext;
  long *plVar28;
  BVSparse<Memory::JitArenaAllocator> *pBVar29;
  BVSparse<Memory::JitArenaAllocator> *pBVar30;
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  BVSparseNode *pBVar31;
  ValueInfo *pVVar32;
  Sym *pSVar33;
  Loop *currentLoop;
  SymTable *pSVar34;
  SymTable *pSVar35;
  Type_conflict pBVar36;
  BVSparseNode *pBVar37;
  ValueInfo *pVVar38;
  Sym *pSVar39;
  ulong uVar40;
  BigBlock *pBVar41;
  Sym *pSVar42;
  Func *pFVar43;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar44;
  BasicBlock *pBVar45;
  Loop *loop;
  PathDependentInfoToRestore PVar46;
  PathDependentInfoToRestore infoToRestore;
  undefined1 local_250 [8];
  EditingIterator iter;
  GlobOptBlockData blockData;
  BVSparse<Memory::JitArenaAllocator> local_158;
  ValueInfo *pVStack_138;
  ValueInfo *valueInfo;
  JitArenaAllocator *local_128;
  BVSparse<Memory::JitArenaAllocator> *local_120;
  Iterator local_118;
  undefined1 auStack_108 [8];
  SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap;
  BVSparse<Memory::JitArenaAllocator> local_c8;
  JitArenaAllocator *local_a0;
  GlobOptBlockData *local_98;
  GlobOptBlockData *local_90;
  Loop *local_88;
  BVSparse<Memory::JitArenaAllocator> *local_80;
  Sym *pSStack_78;
  Sym *sym;
  JitArenaAllocator *local_68;
  Type local_60;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *local_58;
  SymTable *local_50;
  undefined4 *local_48;
  BasicBlock *local_40;
  GlobOpt *local_38;
  
  uVar14 = *(uint *)&globOpt->field_0xf4;
  local_40 = this;
  local_38 = globOpt;
  if ((uVar14 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x132f,"(!globOpt->isCallHelper)","!globOpt->isCallHelper");
    if (!bVar13) {
LAB_0041e2ba:
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    *puVar16 = 0;
    uVar14 = *(uint *)&local_38->field_0xf4;
  }
  pGVar12 = local_38;
  pBVar45 = local_40;
  local_98 = &local_40->globOptData;
  iter.last = (NodeBase *)0x0;
  if ((uVar14 & 0x20) != 0) {
    GlobOptBlockData::CopyBlockData((GlobOptBlockData *)&iter.last,local_98);
    return;
  }
  GlobOptBlockData::NullOutBlockData((GlobOptBlockData *)&iter.last,local_38,local_38->func);
  symsRequiringCompensationToMergedValueInfoMap.entries = (Type)pGVar12->tempAlloc;
  local_c8.lastUsedNodePrevNextField = &local_c8.head;
  local_c8.head = (Type_conflict)0x0;
  local_c8.lastFoundIndex = (Type_conflict)0x0;
  symsRequiringCompensationToMergedValueInfoMap.alloc = (Type)auStack_108;
  auStack_108 = (undefined1  [8])0x0;
  symsRequiringCompensationToMergedValueInfoMap.buckets = (Type)0x0;
  pSVar42 = (Sym *)&pBVar45->predList;
  local_50 = (SymTable *)CONCAT71((int7)((ulong)&stack0xffffffffffffff88 >> 8),1);
  local_c8.alloc = (Type)symsRequiringCompensationToMergedValueInfoMap.entries;
  pSStack_78 = pSVar42;
  sym = pSVar42;
  local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  local_58 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)pSVar42;
LAB_0041cdf8:
  if (pSVar42 == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_48 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                        ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar13) goto LAB_0041e2ba;
    *local_48 = 0;
    pSVar42 = sym;
  }
  pSVar42 = (Sym *)(((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&pSVar42->_vptr_Sym
                    )->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (pSVar42 != pSStack_78) {
    sym = pSVar42;
    ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&stack0xffffffffffffff88);
    pBVar45 = (*ppFVar17)->predBlock;
    if (pBVar45 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_48 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1343,"(pred)","pred");
      if (!bVar13) goto LAB_0041e2ba;
      *local_48 = 0;
    }
    this_00 = (pBVar45->globOptData).callSequence;
    if ((this_00 != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
       ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_00->super_SListNodeBase<Memory::ArenaAllocator>).next == this_00)) {
      pJVar2 = local_38->alloc;
      SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::~SListBase(this_00);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar2,
                 this_00,0x10);
      (pBVar45->globOptData).callSequence =
           (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    if ((((local_40->field_0x18 & 4) != 0) &&
        (pLVar4 = local_38->prePassLoop, pLVar4 != (Loop *)0x0)) && (pLVar4 == local_40->loop))
    goto code_r0x0041cf3f;
    goto LAB_0041cf04;
  }
  if (auStack_108 != (undefined1  [8])0x0) {
    auVar8 = auStack_108;
    pBVar36 = *(Type_conflict *)
               &symsRequiringCompensationToMergedValueInfoMap.entries[5].
                super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.next;
    do {
      pBVar25 = (Type_conflict)auVar8;
      auVar8 = (undefined1  [8])pBVar25->next;
      pBVar25->next = pBVar36;
      pBVar36 = pBVar25;
    } while (auVar8 != (undefined1  [8])0x0);
    *(Type_conflict *)
     &symsRequiringCompensationToMergedValueInfoMap.entries[5].
      super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
      super_KeyValueEntry<Sym_*,_ValueInfo_*>.
      super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
      .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.next = pBVar25;
  }
  if (iter.last == (NodeBase *)0x0) {
    GlobOptBlockData::InitBlockData((GlobOptBlockData *)&iter.last,local_38,local_38->func);
  }
  bVar13 = GlobOpt::DoObjTypeSpec(local_38);
  if (!bVar13) {
    GlobOpt::KillAllObjectTypes(local_38,(local_40->globOptData).liveFields);
  }
  GlobOptBlockData::CopyBlockData(local_98,(GlobOptBlockData *)&iter.last);
  if (local_38->prePassLoop != (Loop *)0x0) {
    if (local_40->loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_48 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1392,"(this->loop)","this->loop");
      if (!bVar13) goto LAB_0041e2ba;
      *local_48 = 0;
    }
    bVar13 = GlobOpt::DoBoundCheckHoist(local_38);
    if (bVar13) {
      GlobOpt::SetInductionVariableValueNumbers(local_38,(GlobOptBlockData *)&iter.last);
    }
    if (((local_40->field_0x18 & 4) != 0) && (local_38->rootLoopPrePass == local_40->loop)) {
      if (local_40->loop->bailOutInfo != (BailOutInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x139c,"(this->loop->bailOutInfo == nullptr)",
                            "this->loop->bailOutInfo == nullptr");
        if (!bVar13) goto LAB_0041e2ba;
        *local_48 = 0;
      }
      pBVar18 = CreateLoopTopBailOutInfo(local_40,local_38);
      local_40->loop->bailOutInfo = pBVar18;
    }
LAB_0041e276:
    if ((SymTable *)local_c8.head == (SymTable *)0x0) {
      return;
    }
    pSVar35 = (SymTable *)(local_c8.alloc)->bvFreeList;
    do {
      pSVar34 = (SymTable *)local_c8.head;
      local_c8.head = (Type_conflict)pSVar34->m_table[0];
      pSVar34->m_table[0] = (Sym *)pSVar35;
      pSVar35 = pSVar34;
    } while ((SymTable *)local_c8.head != (SymTable *)0x0);
    (local_c8.alloc)->bvFreeList = (BVSparseNode *)pSVar34;
    return;
  }
  CleanUpValueMaps(local_40);
  JsUtil::
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)auStack_108,local_38->tempAlloc,0);
  pBVar29 = &local_c8;
  do {
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
    if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041d41e;
  } while (((Type *)&pBVar29->alloc)->word == 0);
  if ((SymTable *)local_c8.head != (SymTable *)0x0) {
    pSVar35 = local_40->func->m_symTable;
    pSVar34 = (SymTable *)local_c8.head;
    do {
      pSVar42 = pSVar34->m_table[2];
      local_50 = pSVar34;
      if (pSVar42 != (Sym *)0x0) {
        iVar1 = *(int *)(pSVar34->m_table + 1);
        uVar40 = 0;
        if (pSVar42 != (Sym *)0x0) {
          for (; ((ulong)pSVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar40);
          pSStack_78 = SymTable::Find(pSVar35,iVar1 + (BVIndex)uVar40);
          if (pSStack_78 == (Sym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13b1,"(sym)","sym");
            if (!bVar13) goto LAB_0041e2ba;
            *local_48 = 0;
          }
          pVVar19 = GlobOptBlockData::FindValue((GlobOptBlockData *)&iter.last,pSStack_78);
          if (pVVar19 != (Value *)0x0) {
            pVStack_138 = pVVar19->valueInfo;
            bVar13 = ValueInfo::IsArrayValueInfo(pVStack_138);
            if (bVar13) {
              JsUtil::
              BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)auStack_108,&stack0xffffffffffffff88,&stack0xfffffffffffffec8);
            }
          }
          pSVar42 = (Sym *)((ulong)pSVar42 & ~(1L << (uVar40 & 0x3f)));
          uVar40 = 0;
          if (pSVar42 != (Sym *)0x0) {
            for (; ((ulong)pSVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
        } while (pSVar42 != (Sym *)0x0);
      }
      pSVar34 = (SymTable *)local_50->m_table[0];
    } while (pSVar34 != (SymTable *)0x0);
    if ((SymTable *)local_c8.head != (SymTable *)0x0) {
      pSVar35 = (SymTable *)(local_c8.alloc)->bvFreeList;
      do {
        pSVar34 = (SymTable *)local_c8.head;
        local_c8.head = (Type_conflict)pSVar34->m_table[0];
        pSVar34->m_table[0] = (Sym *)pSVar35;
        pSVar35 = pSVar34;
      } while ((SymTable *)local_c8.head != (SymTable *)0x0);
      (local_c8.alloc)->bvFreeList = (BVSparseNode *)pSVar34;
    }
  }
  local_c8.lastUsedNodePrevNextField = &local_c8.head;
  local_c8.head = (Type_conflict)0x0;
  local_c8.lastFoundIndex = (Type_conflict)0x0;
LAB_0041d41e:
  if ((local_40->field_0x18 & 4) != 0) {
    local_80 = local_38->tempBv;
    pBVar29 = local_80;
    do {
      pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
      if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041d490;
    } while (((Type *)&pBVar29->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_48 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x13d0,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
    if (!bVar13) goto LAB_0041e2ba;
    *local_48 = 0;
LAB_0041d490:
    pBVar29 = local_80;
    pLVar4 = local_40->loop;
    local_50 = local_40->func->m_symTable;
    local_a0 = local_38->alloc;
    BVSparse<Memory::JitArenaAllocator>::Or
              (local_80,pLVar4->likelyIntSymsUsedBeforeDefined,pLVar4->symsDefInLoop);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              (pBVar29,(BVSparse<Memory::JitArenaAllocator> *)0x0);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (pBVar29,(BVSparse<Memory::JitArenaAllocator> *)0x0);
    pGVar20 = (GlobOptBlockData *)pBVar29->head;
    local_88 = pLVar4;
    while (pBVar29 = local_80, pLVar4 = local_88, pGVar20 != (GlobOptBlockData *)0x0) {
      pBVar41 = ((ArenaData *)&pGVar20->liveFields)->bigBlocks;
      local_90 = pGVar20;
      if (pBVar41 != (BigBlock *)0x0) {
        uVar15 = *(uint *)&pGVar20->exprToValueMap;
        uVar40 = 0;
        if (pBVar41 != (BigBlock *)0x0) {
          for (; ((ulong)pBVar41 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar40);
          pSVar21 = SymTable::FindStackSym(local_50,uVar15 + (BVIndex)uVar40);
          if (pSVar21 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13dc,"(varSym)","varSym");
            if (!bVar13) goto LAB_0041e2ba;
            *local_48 = 0;
          }
          pVVar19 = GlobOptBlockData::FindValue((GlobOptBlockData *)&iter.last,&pSVar21->super_Sym);
          if (pVVar19 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13de,"(value)","value");
            if (!bVar13) goto LAB_0041e2ba;
            *local_48 = 0;
          }
          pVVar22 = pVVar19->valueInfo;
          bVar13 = ValueType::IsInt(&pVVar22->super_ValueType);
          if (!bVar13) {
            pVVar22 = ValueInfo::SpecializeToInt32(pVVar22,local_a0,false);
            GlobOpt::ChangeValueInfo(local_38,(BasicBlock *)0x0,pVVar19,pVVar22,false,false);
          }
          pBVar41 = (BigBlock *)((ulong)pBVar41 & ~(1L << (uVar40 & 0x3f)));
          uVar40 = 0;
          if (pBVar41 != (BigBlock *)0x0) {
            for (; ((ulong)pBVar41 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
        } while (pBVar41 != (BigBlock *)0x0);
      }
      pGVar20 = (GlobOptBlockData *)local_90->symToValueMap;
    }
    BVSparse<Memory::JitArenaAllocator>::Or
              (local_80,local_88->likelyNumberSymsUsedBeforeDefined,local_88->symsDefInLoop);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (pBVar29,pLVar4->forceFloat64SymsOnEntry);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              (pBVar29,(BVSparse<Memory::JitArenaAllocator> *)0x0);
    pLVar23 = (Loop *)pBVar29->head;
    if (pLVar23 != (Loop *)0x0) {
      local_90 = &pLVar4->landingPad->globOptData;
      do {
        pFVar43 = pLVar23->topFunc;
        local_88 = pLVar23;
        if (pFVar43 != (Func *)0x0) {
          iVar1 = *(int *)&pLVar23->headBlock;
          uVar40 = 0;
          if (pFVar43 != (Func *)0x0) {
            for (; ((ulong)pFVar43 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar40);
            pSVar21 = SymTable::FindStackSym(local_50,iVar1 + (BVIndex)uVar40);
            if (pSVar21 == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_48 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                  ,0x13ee,"(varSym)","varSym");
              if (!bVar13) goto LAB_0041e2ba;
              *local_48 = 0;
            }
            pSVar24 = StackSym::GetFloat64EquivSym(pSVar21,(Func *)0x0);
            if (((pSVar24 == (StackSym *)0x0) || ((pSVar24->field_0x1a & 2) != 0)) ||
               (bVar13 = GlobOptBlockData::IsFloat64TypeSpecialized(local_90,&pSVar21->super_Sym),
               !bVar13)) {
              pVVar19 = GlobOptBlockData::FindValue
                                  ((GlobOptBlockData *)&iter.last,&pSVar21->super_Sym);
              if (pVVar19 == (Value *)0x0) {
                pVVar19 = GlobOpt::NewGenericValue(local_38,(ValueType)0x108);
                GlobOptBlockData::SetValue(local_98,pVVar19,&pSVar21->super_Sym);
              }
              else {
                pVVar22 = pVVar19->valueInfo;
                bVar13 = ValueType::IsNumber(&pVVar22->super_ValueType);
                if (!bVar13) {
                  pVVar22 = ValueInfo::SpecializeToFloat64(pVVar22,local_a0);
                  GlobOpt::ChangeValueInfo(local_38,local_40,pVVar19,pVVar22,false,false);
                }
              }
            }
            pFVar43 = (Func *)((ulong)pFVar43 & ~(1L << (uVar40 & 0x3f)));
            uVar40 = 0;
            if (pFVar43 != (Func *)0x0) {
              for (; ((ulong)pFVar43 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
          } while (pFVar43 != (Func *)0x0);
        }
        pLVar23 = *(Loop **)local_88;
      } while (pLVar23 != (Loop *)0x0);
      pBVar29 = local_80;
      if (local_80->head != (Type_conflict)0x0) {
        pJVar9 = local_80->alloc;
        pBVar10 = local_80->head;
        pBVar36 = pJVar9->bvFreeList;
        do {
          pBVar25 = pBVar10;
          pBVar10 = pBVar25->next;
          pBVar25->next = pBVar36;
          pBVar36 = pBVar25;
        } while (pBVar10 != (Type)0x0);
        pJVar9->bvFreeList = pBVar25;
      }
    }
    pBVar29->head = (Type_conflict)0x0;
    pBVar29->lastFoundIndex = (Type_conflict)0x0;
    pBVar29->lastUsedNodePrevNextField = &pBVar29->head;
  }
  pBVar29 = local_38->tempBv;
  do {
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
    if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041d877;
  } while (((Type *)&pBVar29->alloc)->word == 0);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *local_48 = 1;
  bVar13 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,0x1413,"(globOpt->tempBv->IsEmpty())","globOpt->tempBv->IsEmpty()");
  if (!bVar13) goto LAB_0041e2ba;
  *local_48 = 0;
LAB_0041d877:
  local_158.alloc = local_38->tempAlloc;
  pSStack_78 = (Sym *)0x0;
  sym = (Sym *)0x0;
  local_60 = (Type)&stack0xffffffffffffff88;
  pVStack_138 = (ValueInfo *)0x0;
  valueInfo = (ValueInfo *)0x0;
  local_158.head = (BVSparseNode *)0x0;
  local_158.lastFoundIndex = (Type_conflict)0x0;
  local_250 = (undefined1  [8])local_58;
  iter.super_Iterator.list = local_58;
  iter.super_Iterator.current = (NodeBase *)0x0;
  local_50 = (SymTable *)&DAT_015b6718;
  local_158.lastUsedNodePrevNextField = &local_158.head;
  local_128 = local_158.alloc;
  local_120 = (BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8;
  local_68 = local_158.alloc;
LAB_0041d8e5:
  do {
    bVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                       ((EditingIterator *)local_250);
    if (!bVar13) {
      local_118.list = local_58;
      local_118.current = &local_58->super_SListNodeBase<Memory::ArenaAllocator>;
      while( true ) {
        if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_118.current ==
            (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar13) goto LAB_0041e2ba;
          *local_48 = 0;
        }
        pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &(local_118.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar7 == local_118.list) break;
        local_118.current = (NodeBase *)pSVar7;
        ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             (&local_118);
        pBVar45 = (*ppFVar17)->predBlock;
        if (((local_40->field_0x18 & 4) == 0) || (local_40->loop != pBVar45->loop)) {
          if ((pBVar45->field_0x18 & 0x40) != 0) {
            DecrementDataUseCount(pBVar45);
            pSVar5 = (pBVar45->predList).
                     super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
            pSVar44 = &pBVar45->predList;
            if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == pSVar44) ||
               ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next != pSVar44)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_48 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                  ,0x148c,"(pred->GetPredList()->HasOne())",
                                  "pred->GetPredList()->HasOne()");
              if (!bVar13) goto LAB_0041e2ba;
              *local_48 = 0;
            }
            ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                                 (&pSVar44->
                                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
            pBVar45 = (*ppFVar17)->predBlock;
          }
          uVar15 = DecrementDataUseCount(pBVar45);
          if ((uVar15 == 0) &&
             ((pLVar4 = local_40->loop, pLVar4 == (Loop *)0x0 || (pLVar4->landingPad != pBVar45))))
          {
            pSVar5 = (pBVar45->succList).
                     super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
            if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 ==
                 &pBVar45->succList) ||
               (((((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next !=
                   &pBVar45->succList ||
                  (pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                            (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                             &local_58->super_SListNodeBase<Memory::ArenaAllocator>)->
                            super_SListNodeBase<Memory::ArenaAllocator>).next, pSVar7 == local_58))
                 || (pLVar4 != (Loop *)0x0)) ||
                ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (pSVar7->super_SListNodeBase<Memory::ArenaAllocator>).next != local_58)))) {
              GlobOptBlockData::DeleteBlockData(&pBVar45->globOptData);
            }
            else {
              GlobOptBlockData::NullOutBlockData(&pBVar45->globOptData,local_38,local_38->func);
            }
          }
        }
      }
      pBVar29 = local_38->tempBv;
      if (pBVar29->head != (Type_conflict)0x0) {
        pJVar9 = pBVar29->alloc;
        pBVar10 = pBVar29->head;
        pBVar36 = pJVar9->bvFreeList;
        do {
          pBVar25 = pBVar10;
          pBVar10 = pBVar25->next;
          pBVar25->next = pBVar36;
          pBVar36 = pBVar25;
        } while (pBVar10 != (Type)0x0);
        pJVar9->bvFreeList = pBVar25;
      }
      pBVar29->head = (Type_conflict)0x0;
      pBVar29->lastFoundIndex = (Type_conflict)0x0;
      pBVar29->lastUsedNodePrevNextField = &pBVar29->head;
      if (local_38->prePassLoop != (Loop *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x149f,"(!globOpt->IsLoopPrePass())","!globOpt->IsLoopPrePass()");
        if (!bVar13) goto LAB_0041e2ba;
        *local_48 = 0;
      }
      pGVar12 = local_38;
      pLVar4 = local_40->loop;
      if ((local_40->field_0x18 & 4) == 0) {
        if (pLVar4 == (Loop *)0x0) {
          local_40->dataUseCount =
               (local_40->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
               super_RealCount.count;
        }
        else if (pLVar4->dominatingLoopCountableBlock == local_40) {
          GlobOpt::DetermineLoopCount(local_38,pLVar4);
        }
      }
      else {
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,local_38->alloc,0x3eba5c);
        pJVar9 = pGVar12->alloc;
        pBVar30->head = (Type_conflict)0x0;
        pBVar30->lastFoundIndex = (Type_conflict)0x0;
        pBVar30->alloc = pJVar9;
        pBVar30->lastUsedNodePrevNextField = (Type)pBVar30;
        pLVar4->varSymsOnEntry = pBVar30;
        pBVar29 = (local_40->globOptData).liveVarSyms;
        BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
        BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                  (pBVar30,pBVar29->head);
        pGVar12 = local_38;
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,local_38->alloc,0x3eba5c);
        pJVar9 = pGVar12->alloc;
        pBVar30->head = (Type_conflict)0x0;
        pBVar30->lastFoundIndex = (Type_conflict)0x0;
        pBVar30->alloc = pJVar9;
        pBVar30->lastUsedNodePrevNextField = (Type)pBVar30;
        pLVar4->int32SymsOnEntry = pBVar30;
        pBVar29 = (local_40->globOptData).liveInt32Syms;
        BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
        BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                  (pBVar30,pBVar29->head);
        pGVar12 = local_38;
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,local_38->alloc,0x3eba5c);
        pJVar9 = pGVar12->alloc;
        pBVar30->head = (Type_conflict)0x0;
        pBVar30->lastFoundIndex = (Type_conflict)0x0;
        pBVar30->alloc = pJVar9;
        pBVar30->lastUsedNodePrevNextField = (Type)pBVar30;
        pLVar4->lossyInt32SymsOnEntry = pBVar30;
        pBVar29 = (local_40->globOptData).liveLossyInt32Syms;
        BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
        BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                  (pBVar30,pBVar29->head);
        pGVar12 = local_38;
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,local_38->alloc,0x3eba5c);
        pJVar9 = pGVar12->alloc;
        pBVar30->head = (Type_conflict)0x0;
        pBVar30->lastFoundIndex = (Type_conflict)0x0;
        pBVar30->alloc = pJVar9;
        pBVar30->lastUsedNodePrevNextField = (Type)pBVar30;
        pLVar4->float64SymsOnEntry = pBVar30;
        pBVar29 = (local_40->globOptData).liveFloat64Syms;
        BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
        BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                  (pBVar30,pBVar29->head);
        pGVar12 = local_38;
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,local_38->alloc,0x3eba5c);
        pJVar9 = pGVar12->alloc;
        pBVar30->head = (Type_conflict)0x0;
        pBVar30->lastFoundIndex = (Type_conflict)0x0;
        pBVar30->alloc = pJVar9;
        pBVar30->lastUsedNodePrevNextField = (Type)pBVar30;
        pLVar4->liveFieldsOnEntry = pBVar30;
        pBVar29 = (local_40->globOptData).liveFields;
        BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar29);
        BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                  (pBVar30,pBVar29->head);
        pGVar12 = local_38;
        if (symsRequiringCompensationToMergedValueInfoMap.size !=
            symsRequiringCompensationToMergedValueInfoMap.count) {
          this_03 = (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)new<Memory::JitArenaAllocator>(0x38,local_38->alloc,0x3eba5c);
          JsUtil::
          BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::BaseDictionary(this_03,pGVar12->alloc,0);
          pLVar4->symsRequiringCompensationToMergedValueInfoMap = this_03;
          JsUtil::
          BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          DoCopy<JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                    ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_03,
                     (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)auStack_108);
        }
        bVar13 = GlobOpt::DoBoundCheckHoist(local_38);
        if ((bVar13) && (pLVar4->inductionVariables != (InductionVariableSet *)0x0)) {
          GlobOpt::FinalizeInductionVariables(local_38,pLVar4,(GlobOptBlockData *)&iter.last);
          bVar13 = GlobOpt::DoLoopCountBasedBoundCheckHoist(local_38);
          if (bVar13) {
            GlobOpt::DetermineDominatingLoopCountableBlock(local_38,pLVar4,local_40);
          }
        }
      }
      if (local_158.head != (BVSparseNode *)0x0) {
        pBVar10 = local_158.head;
        pBVar37 = (local_158.alloc)->bvFreeList;
        do {
          pBVar31 = pBVar10;
          pBVar10 = pBVar31->next;
          pBVar31->next = pBVar37;
          pBVar37 = pBVar31;
        } while (pBVar10 != (Type)0x0);
        (local_158.alloc)->bvFreeList = pBVar31;
      }
      if (pVStack_138 != (ValueInfo *)0x0) {
        pVVar22 = pVStack_138;
        pVVar38 = (ValueInfo *)local_128->bvFreeList;
        do {
          pVVar32 = pVVar22;
          pVVar22 = (ValueInfo *)pVVar32->_vptr_ValueInfo;
          pVVar32->_vptr_ValueInfo = (_func_int **)pVVar38;
          pVVar38 = pVVar32;
        } while (pVVar22 != (ValueInfo *)0x0);
        local_128->bvFreeList = (BVSparseNode *)pVVar32;
      }
      if (pSStack_78 != (Sym *)0x0) {
        pSVar42 = pSStack_78;
        pSVar39 = (Sym *)local_68->bvFreeList;
        do {
          pSVar33 = pSVar42;
          pSVar42 = (Sym *)(((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                            &pSVar33->_vptr_Sym)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&pSVar33->_vptr_Sym)->
          super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)pSVar39;
          pSVar39 = pSVar33;
        } while (pSVar42 != (Sym *)0x0);
        local_68->bvFreeList = (BVSparseNode *)pSVar33;
      }
      JsUtil::
      BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_108);
      goto LAB_0041e276;
    }
    ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_250);
    pBVar45 = (*ppFVar17)->predBlock;
    if ((pBVar45->loop == (Loop *)0x0) ||
       (pBVar26 = Loop::GetHeadBlock(pBVar45->loop), pBVar26 != local_40)) {
      if ((pBVar45->field_0x18 & 0x40) == 0) {
        toBlockContext = (BasicBlock *)0x0;
        pBVar26 = pBVar45;
      }
      else {
        pSVar44 = &pBVar45->predList;
        pSVar5 = (pBVar45->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
        if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == pSVar44) ||
           ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next != pSVar44)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x1427,"(pred->GetPredList()->HasOne())",
                              "pred->GetPredList()->HasOne()");
          if (!bVar13) goto LAB_0041e2ba;
          *local_48 = 0;
        }
        ppFVar27 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&pSVar44->
                               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
        pBVar26 = (*ppFVar27)->predBlock;
        toBlockContext = pBVar45;
      }
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)&stack0xffffffffffffff88,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0,(pBVar26->globOptData).liveInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      BVSparse<Memory::JitArenaAllocator>::Minus
                (local_38->tempBv,(pBVar26->globOptData).liveInt32Syms,
                 (pBVar26->globOptData).liveLossyInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8,local_38->tempBv);
      BVSparse<Memory::JitArenaAllocator>::Minus
                (local_38->tempBv,(BVSparse<Memory::JitArenaAllocator> *)0x0,
                 (pBVar26->globOptData).liveVarSyms);
      BVSparse<Memory::JitArenaAllocator>::Minus
                (&local_158,(BVSparse<Memory::JitArenaAllocator> *)0x0,
                 (pBVar26->globOptData).liveFloat64Syms);
      pBVar29 = local_38->tempBv;
      do {
        pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
        if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          plVar28 = (long *)&stack0xffffffffffffff88;
          goto LAB_0041da52;
        }
      } while (((Type *)&pBVar29->alloc)->word == 0);
      goto LAB_0041daaa;
    }
    DecrementDataUseCount(pBVar45);
  } while( true );
code_r0x0041cf3f:
  pLVar23 = pBVar45->loop;
  bVar13 = pLVar23 != (Loop *)0x0;
  if (pLVar23 != pLVar4 && bVar13) {
    do {
      pLVar23 = pLVar23->parent;
      bVar13 = pLVar23 != (Loop *)0x0;
      if (pLVar23 == pLVar4) break;
    } while (pLVar23 != (Loop *)0x0);
  }
  pSVar42 = sym;
  if (!bVar13) {
LAB_0041cf04:
    pPVar3 = (*ppFVar17)->pathDependentInfo;
    if (pPVar3 == (PathDependentInfo *)0x0) {
      PVar46.rightValueInfo = (ValueInfo *)0x0;
      PVar46.leftValueInfo = (ValueInfo *)*ppFVar17;
      pVVar22 = (ValueInfo *)0x0;
    }
    else {
      PVar46 = GlobOpt::UpdatePathDependentInfo(local_38,pPVar3);
      pVVar22 = PVar46.leftValueInfo;
    }
    pVVar38 = PVar46.rightValueInfo;
    if (pBVar45->dataUseCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_48 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1359,"(pred->GetDataUseCount())","pred->GetDataUseCount()");
      if (!bVar13) goto LAB_0041e2ba;
      *local_48 = 0;
    }
    if (iter.last == (NodeBase *)0x0) {
      pSVar5 = (pBVar45->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == &pBVar45->succList) ||
          ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next !=
           &pBVar45->succList)) ||
         ((pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                     &local_58->super_SListNodeBase<Memory::ArenaAllocator>)->
                    super_SListNodeBase<Memory::ArenaAllocator>).next, pSVar7 == local_58 ||
          (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
            (pSVar7->super_SListNodeBase<Memory::ArenaAllocator>).next != local_58 ||
           (local_40->loop != (Loop *)0x0)))))) {
        GlobOptBlockData::CloneBlockData((GlobOptBlockData *)&iter.last,local_40,pBVar45);
      }
      else {
        GlobOptBlockData::ReuseBlockData((GlobOptBlockData *)&iter.last,&pBVar45->globOptData);
        pVVar38 = (ValueInfo *)0x0;
        pVVar22 = (ValueInfo *)0x0;
      }
    }
    else {
      bVar13 = local_38->prePassLoop == (Loop *)0x0;
      pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      if (bVar13) {
        pBVar29 = &local_c8;
      }
      pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      if (bVar13) {
        pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)auStack_108;
      }
      GlobOptBlockData::MergeBlockData
                ((GlobOptBlockData *)&iter.last,local_40,pBVar45,pBVar29,pBVar30,
                 (bool)((byte)local_50 & 1));
      local_50 = (SymTable *)0x0;
    }
    pSVar42 = sym;
    if (pPVar3 != (PathDependentInfo *)0x0) {
      infoToRestore.rightValueInfo = pVVar38;
      infoToRestore.leftValueInfo = pVVar22;
      GlobOpt::RestorePathDependentInfo(local_38,pPVar3,infoToRestore);
      pFVar6 = *ppFVar17;
      pJVar2 = local_38->alloc;
      pPVar3 = pFVar6->pathDependentInfo;
      pPVar3->leftValue = (Value *)pJVar2->bvFreeList;
      pJVar2->bvFreeList = (BVSparseNode *)pPVar3;
      pFVar6->pathDependentInfo = (PathDependentInfo *)0x0;
      pSVar42 = sym;
    }
  }
  goto LAB_0041cdf8;
  while (plVar28[2] == 0) {
LAB_0041da52:
    plVar28 = (long *)*plVar28;
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8;
    if (plVar28 == (long *)0x0) goto LAB_0041da73;
  }
  goto LAB_0041daaa;
  while (((Type *)&pBVar29->alloc)->word == 0) {
LAB_0041da73:
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
    pBVar30 = &local_158;
    if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041da87;
  }
  goto LAB_0041daaa;
  while (((Type *)&pBVar30->alloc)->word == 0) {
LAB_0041da87:
    pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)pBVar30->head;
    if (pBVar30 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (symsRequiringCompensationToMergedValueInfoMap.size ==
          symsRequiringCompensationToMergedValueInfoMap.count) goto LAB_0041d8e5;
      break;
    }
  }
LAB_0041daaa:
  ppFVar27 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                       (&(pBVar26->succList).
                         super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  if (((*ppFVar27)->succBlock != local_40) ||
     (((pBVar26->loop != (Loop *)0x0 && (pBVar26->loop->parent == local_40->loop)) &&
      (1 < (pBVar26->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_RealCount.count)))) {
    if (toBlockContext == (BasicBlock *)0x0) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(local_40->func->m_workItem);
      uVar15 = JITTimeFunctionBody::GetSourceContextId(this_01);
      this_02 = JITTimeWorkItem::GetJITTimeInfo(local_40->func->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
      bVar13 = Js::Phases::IsEnabled((Phases *)local_50,GlobOptPhase,uVar15,functionId);
      if ((bVar13) && (local_38->prePassLoop == (Loop *)0x0)) {
        Output::Print(L"TRACE: ");
        Output::Print(L"Inserting airlock block to convert syms to var between block %d and %d\n",
                      (ulong)pBVar26->number,(ulong)local_40->number);
        Output::Flush();
      }
      toBlockContext = FlowGraph::InsertAirlockBlock(local_38->func->m_fg,*ppFVar17,false);
    }
    else {
      if ((toBlockContext->field_0x18 & 0x40) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x145a,"(orgPred->isAirLockCompensationBlock)",
                            "orgPred->isAirLockCompensationBlock");
        if (!bVar13) goto LAB_0041e2ba;
        *local_48 = 0;
      }
      DecrementDataUseCount(pBVar26);
      toBlockContext->field_0x18 = toBlockContext->field_0x18 & 0xbf;
    }
    GlobOptBlockData::CloneBlockData(&toBlockContext->globOptData,toBlockContext,pBVar26);
    pBVar26 = toBlockContext;
  }
  pBVar29 = local_38->tempBv;
  do {
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
    if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041dc4f;
  } while (((Type *)&pBVar29->alloc)->word == 0);
  GlobOpt::ToVar(local_38,local_38->tempBv,pBVar26,(Instr *)0x0);
LAB_0041dc4f:
  plVar28 = (long *)&stack0xffffffffffffff88;
  do {
    plVar28 = (long *)*plVar28;
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8;
    if (plVar28 == (long *)0x0) goto LAB_0041dc7d;
  } while (plVar28[2] == 0);
  GlobOpt::ToInt32(local_38,(BVSparse<Memory::JitArenaAllocator> *)&stack0xffffffffffffff88,pBVar26,
                   true,(Instr *)0x0);
LAB_0041dc7d:
  do {
    pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head;
    pBVar30 = &local_158;
    if (pBVar29 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041dca3;
  } while (((Type *)&pBVar29->alloc)->word == 0);
  GlobOpt::ToInt32(local_38,(BVSparse<Memory::JitArenaAllocator> *)&stack0xfffffffffffffec8,pBVar26,
                   false,(Instr *)0x0);
LAB_0041dca3:
  do {
    pBVar30 = (BVSparse<Memory::JitArenaAllocator> *)pBVar30->head;
    if (pBVar30 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041dcc1;
  } while (((Type *)&pBVar30->alloc)->word == 0);
  GlobOpt::ToFloat64(local_38,&local_158,pBVar26);
LAB_0041dcc1:
  if (symsRequiringCompensationToMergedValueInfoMap.size !=
      symsRequiringCompensationToMergedValueInfoMap.count) {
    GlobOpt::InsertValueCompensation(local_38,pBVar26,local_40,(SymToValueInfoMap *)auStack_108);
  }
  goto LAB_0041d8e5;
}

Assistant:

void
BasicBlock::MergePredBlocksValueMaps(GlobOpt* globOpt)
{
    Assert(!globOpt->isCallHelper);
    // We keep a local temporary copy for the merge
    GlobOptBlockData blockData(this->globOptData.curFunc);

    if (!globOpt->isRecursiveCallOnLandingPad)
    {
        blockData.NullOutBlockData(globOpt, globOpt->func);
    }
    else
    {
        // If we are going over the landing pad again after field PRE, just start again
        // with the value table where we left off.
        blockData.CopyBlockData(&this->globOptData);
        return;
    }

    BVSparse<JitArenaAllocator> symsRequiringCompensation(globOpt->tempAlloc);
    {
        BVSparse<JitArenaAllocator> symsCreatedForMerge(globOpt->tempAlloc);
        bool forceTypeSpecOnLoopHeader = true;
        FOREACH_PREDECESSOR_BLOCK(pred, this)
        {
            if (pred->globOptData.callSequence && pred->globOptData.callSequence->Empty())
            {
                JitAdelete(globOpt->alloc, pred->globOptData.callSequence);
                pred->globOptData.callSequence = nullptr;
            }
            if (this->isLoopHeader && globOpt->IsLoopPrePass() && globOpt->prePassLoop == this->loop && this->loop->IsDescendentOrSelf(pred->loop))
            {
                // Loop back-edge.
                // First pass on loop runs optimistically, without doing transforms.
                // Skip this edge for now.
                continue;
            }

            PathDependentInfo *const pathDependentInfo = __edge->GetPathDependentInfo();
            PathDependentInfoToRestore pathDependentInfoToRestore;
            if (pathDependentInfo)
            {
                pathDependentInfoToRestore = globOpt->UpdatePathDependentInfo(pathDependentInfo);
            }

            Assert(pred->GetDataUseCount());

            // First pred?
            if (blockData.symToValueMap == nullptr)
            {
                // Only one edge?
                if (pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr)
                {
                    blockData.ReuseBlockData(&pred->globOptData);

                    // Don't need to restore the old value info
                    pathDependentInfoToRestore.Clear();
                }
                else
                {
                    blockData.CloneBlockData(this, pred);
                }
            }
            else
            {
                const bool isLoopPrePass = globOpt->IsLoopPrePass();
                blockData.MergeBlockData(
                    this,
                    pred,
                    isLoopPrePass ? nullptr : &symsRequiringCompensation,
                    isLoopPrePass ? nullptr : &symsCreatedForMerge,
                    forceTypeSpecOnLoopHeader);
                forceTypeSpecOnLoopHeader = false; // can force type-spec on the loop header only for the first back edge.
            }

            // Restore the value for the next edge
            if (pathDependentInfo)
            {
                globOpt->RestorePathDependentInfo(pathDependentInfo, pathDependentInfoToRestore);
                __edge->ClearPathDependentInfo(globOpt->alloc);
            }

        } NEXT_PREDECESSOR_BLOCK;
    }

    // Consider: We can recreate values for hoisted field so it can copy prop out of the loop
    if (blockData.symToValueMap == nullptr)
    {
        blockData.InitBlockData(globOpt, globOpt->func);
    }

    if (!globOpt->DoObjTypeSpec())
    {
        // Object type specialization is off, but if copy prop is on (e.g., /force:fieldhoist) we're not clearing liveFields,
        // so we may be letting type syms slip through this block.
        globOpt->KillAllObjectTypes(this->globOptData.liveFields);
    }

    this->globOptData.CopyBlockData(&blockData);

    if (globOpt->IsLoopPrePass())
    {
        Assert(this->loop);

        if(globOpt->DoBoundCheckHoist())
        {
            globOpt->SetInductionVariableValueNumbers(&blockData);
        }

        if (this->isLoopHeader && globOpt->rootLoopPrePass == this->loop)
        {
            // Capture bail out info in case we have optimization that needs it
            Assert(this->loop->bailOutInfo == nullptr);
            this->loop->bailOutInfo = this->CreateLoopTopBailOutInfo(globOpt);
        }

        // If loop pre-pass, don't insert convert from type-spec to var
        return;
    }

    this->CleanUpValueMaps();
    Sym *symIV = nullptr;

    // Clean up the syms requiring compensation by checking the final value in the merged block to see if the sym still requires
    // compensation. All the while, create a mapping from sym to value info in the merged block. This dictionary helps avoid a
    // value lookup in the merged block per predecessor.
    SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap(globOpt->tempAlloc);
    if(!symsRequiringCompensation.IsEmpty())
    {
        const SymTable *const symTable = func->m_symTable;
        FOREACH_BITSET_IN_SPARSEBV(id, &symsRequiringCompensation)
        {
            Sym *const sym = symTable->Find(id);
            Assert(sym);

            Value *const value = blockData.FindValue(sym);
            if(!value)
            {
                continue;
            }

            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsArrayValueInfo())
            {
                continue;
            }

            // At least one new sym was created while merging and associated with the merged value info, so those syms will
            // require compensation in predecessors. For now, the dead store phase is relied upon to remove compensation that is
            // dead due to no further uses of the new sym.
            symsRequiringCompensationToMergedValueInfoMap.Add(sym, valueInfo);
        } NEXT_BITSET_IN_SPARSEBV;
        symsRequiringCompensation.ClearAll();
    }

    if (this->isLoopHeader)
    {
        BVSparse<JitArenaAllocator> * tempBv = globOpt->tempBv;
        // Values on the back-edge in the prepass may be conservative for syms defined in the loop, and type specialization in
        // the prepass is not reflective of the value, but rather, is used to determine whether the sym should be specialized
        // around the loop. Additionally, some syms that are used before defined in the loop may be specialized in the loop
        // header despite not being specialized in the landing pad. Now that the type specialization bit-vectors are merged,
        // specialize the corresponding value infos in the loop header too.

        Assert(tempBv->IsEmpty());
        Loop *const loop = this->loop;
        SymTable *const symTable = func->m_symTable;
        JitArenaAllocator *const alloc = globOpt->alloc;

        // Int-specialized syms
        tempBv->Or(loop->likelyIntSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->And(blockData.liveInt32Syms);
        tempBv->Minus(blockData.liveLossyInt32Syms);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);
            Value *const value = blockData.FindValue(varSym);
            Assert(value);
            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsInt())
            {
                globOpt->ChangeValueInfo(nullptr, value, valueInfo->SpecializeToInt32(alloc));
            }
        } NEXT_BITSET_IN_SPARSEBV;

        // Float-specialized syms
        tempBv->Or(loop->likelyNumberSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->Or(loop->forceFloat64SymsOnEntry);
        tempBv->And(blockData.liveFloat64Syms);
        GlobOptBlockData &landingPadBlockData = loop->landingPad->globOptData;
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);

            // If the type-spec sym is null or if the sym is not float-specialized in the loop landing pad, the sym may have
            // been merged to float on a loop back-edge when it was live as float on the back-edge, and live as int in the loop
            // header. In this case, compensation inserted in the loop landing pad will use BailOutNumberOnly, and so it is
            // guaranteed that the value will be float. Otherwise, if the type-spec sym exists, its field can be checked to see
            // if it's prevented from being anything but a number.
            StackSym *const typeSpecSym = varSym->GetFloat64EquivSym(nullptr);
            if(!typeSpecSym ||
                typeSpecSym->m_requiresBailOnNotNumber ||
                !landingPadBlockData.IsFloat64TypeSpecialized(varSym))
            {
                Value *const value = blockData.FindValue(varSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(!valueInfo->IsNumber())
                    {
                        globOpt->ChangeValueInfo(this, value, valueInfo->SpecializeToFloat64(alloc));
                    }
                }
                else
                {
                    this->globOptData.SetValue(globOpt->NewGenericValue(ValueType::Float), varSym);
                }
            }
        } NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }

    // We need to handle the case where a symbol is type-spec'd coming from some predecessors,
    // but not from others.
    //
    // We can do this by inserting the right conversion in the predecessor block, but we
    // can only do this if we are the first successor of that block, since the previous successors
    // would have already been processed.  Instead, we'll need to break the edge and insert a block
    // (airlock block) to put in the conversion code.
    Assert(globOpt->tempBv->IsEmpty());

    BVSparse<JitArenaAllocator> symsNeedingLossyIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingLosslessIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingFloatConversion(globOpt->tempAlloc);

    FOREACH_PREDECESSOR_EDGE_EDITING(edge, this, iter)
    {
        BasicBlock *pred = edge->GetPred();

        if (pred->loop && pred->loop->GetHeadBlock() == this)
        {
            pred->DecrementDataUseCount();
            // Skip loop back-edges. We will handle these when we get to the exit blocks.
            continue;
        }

        BasicBlock *orgPred = nullptr;
        if (pred->isAirLockCompensationBlock)
        {
            Assert(pred->GetPredList()->HasOne());
            orgPred = pred;
            pred = (pred->GetPredList()->Head())->GetPred();
        }

        // Lossy int in the merged block, and no int in the predecessor - need a lossy conversion to int
        symsNeedingLossyIntConversion.Minus(blockData.liveLossyInt32Syms, pred->globOptData.liveInt32Syms);

        // Lossless int in the merged block, and no lossless int in the predecessor - need a lossless conversion to int
        symsNeedingLosslessIntConversion.Minus(blockData.liveInt32Syms, blockData.liveLossyInt32Syms);
        globOpt->tempBv->Minus(pred->globOptData.liveInt32Syms, pred->globOptData.liveLossyInt32Syms);
        symsNeedingLosslessIntConversion.Minus(globOpt->tempBv);

        globOpt->tempBv->Minus(blockData.liveVarSyms, pred->globOptData.liveVarSyms);
        symsNeedingFloatConversion.Minus(blockData.liveFloat64Syms, pred->globOptData.liveFloat64Syms);

        bool symIVNeedsSpecializing = (symIV && !pred->globOptData.liveInt32Syms->Test(symIV->m_id) && !symsNeedingLosslessIntConversion.Test(symIV->m_id));

        if (!globOpt->tempBv->IsEmpty() ||
            !symsNeedingLossyIntConversion.IsEmpty() ||
            !symsNeedingLosslessIntConversion.IsEmpty() ||
            !symsNeedingFloatConversion.IsEmpty() ||
            symIVNeedsSpecializing ||
            symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            // We can't un-specialize a symbol in a predecessor if we've already processed
            // a successor of that block. Instead, insert a new block on the flow edge
            // (an airlock block) and do the un-specialization there.
            //
            // Alternatively, the current block could be an exit block out of this loop, and so the predecessor may exit the
            // loop. In that case, if the predecessor may continue into the loop without exiting, then we need an airlock block
            // to do the appropriate conversions only on the exit path (preferring not to do the conversions inside the loop).
            // If, on the other hand, the predecessor always flows into the current block, then it always exits, so we don't need
            // an airlock block and can just do the conversions in the predecessor.
            if (pred->GetSuccList()->Head()->GetSucc() != this||
                (pred->loop && pred->loop->parent == this->loop && pred->GetSuccList()->Count() > 1))
            {
                BasicBlock *airlockBlock = nullptr;
                if (!orgPred)
                {
                    if (PHASE_TRACE(Js::GlobOptPhase, this->func) && !globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("TRACE: "));
                        Output::Print(_u("Inserting airlock block to convert syms to var between block %d and %d\n"),
                            pred->GetBlockNum(), this->GetBlockNum());
                        Output::Flush();
                    }
                    airlockBlock = globOpt->func->m_fg->InsertAirlockBlock(edge);
                }
                else
                {
                    Assert(orgPred->isAirLockCompensationBlock);
                    airlockBlock = orgPred;
                    pred->DecrementDataUseCount();
                    airlockBlock->isAirLockCompensationBlock = false; // This is airlock block now. So remove the attribute.
                }
                globOpt->CloneBlockData(airlockBlock, pred);

                pred = airlockBlock;
            }
            if (!globOpt->tempBv->IsEmpty())
            {
                globOpt->ToVar(globOpt->tempBv, pred);
            }
            if (!symsNeedingLossyIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLossyIntConversion, pred, true /* lossy */);
            }
            if (!symsNeedingLosslessIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLosslessIntConversion, pred, false /* lossy */);
            }
            if (!symsNeedingFloatConversion.IsEmpty())
            {
                globOpt->ToFloat64(&symsNeedingFloatConversion, pred);
            }
            if (symIVNeedsSpecializing)
            {
                globOpt->tempBv->ClearAll();
                globOpt->tempBv->Set(symIV->m_id);
                globOpt->ToInt32(globOpt->tempBv, pred, false /* lossy */);
            }
            if(symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
            {
                globOpt->InsertValueCompensation(pred, this, &symsRequiringCompensationToMergedValueInfoMap);
            }
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    FOREACH_PREDECESSOR_EDGE(edge, this)
    {
        // Peak Memory optimization:
        // These are in an arena, but putting them on the free list greatly reduces
        // the peak memory used by the global optimizer for complex flow graphs.
        BasicBlock *pred = edge->GetPred();
        if (!this->isLoopHeader || this->loop != pred->loop)
        {
            // Skip airlock compensation block as we are not going to walk this block.
            if (pred->isAirLockCompensationBlock)
            {
                pred->DecrementDataUseCount();
                Assert(pred->GetPredList()->HasOne());
                pred = (pred->GetPredList()->Head())->GetPred();
            }

            if (pred->DecrementDataUseCount() == 0 && (!this->loop || this->loop->landingPad != pred))
            {
                if (!(pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr))
                {
                    pred->globOptData.DeleteBlockData();
                }
                else
                {
                    pred->globOptData.NullOutBlockData(globOpt, globOpt->func);
                }
            }
        }
    } NEXT_PREDECESSOR_EDGE;

    globOpt->tempBv->ClearAll();
    Assert(!globOpt->IsLoopPrePass());   // We already early return if we are in prepass

    if (this->isLoopHeader)
    {
        Loop *const loop = this->loop;

        // Save values live on loop entry, such that we can adjust the state of the
        // values on the back-edge to match.
        loop->varSymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->varSymsOnEntry->Copy(this->globOptData.liveVarSyms);

        loop->int32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->int32SymsOnEntry->Copy(this->globOptData.liveInt32Syms);

        loop->lossyInt32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->lossyInt32SymsOnEntry->Copy(this->globOptData.liveLossyInt32Syms);

        loop->float64SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->float64SymsOnEntry->Copy(this->globOptData.liveFloat64Syms);

        loop->liveFieldsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->liveFieldsOnEntry->Copy(this->globOptData.liveFields);

        if (symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            loop->symsRequiringCompensationToMergedValueInfoMap = JitAnew(globOpt->alloc, SymToValueInfoMap, globOpt->alloc);
            loop->symsRequiringCompensationToMergedValueInfoMap->Copy(&symsRequiringCompensationToMergedValueInfoMap);
        }
        
        if(globOpt->DoBoundCheckHoist() && loop->inductionVariables)
        {
            globOpt->FinalizeInductionVariables(loop, &blockData);
            if(globOpt->DoLoopCountBasedBoundCheckHoist())
            {
                globOpt->DetermineDominatingLoopCountableBlock(loop, this);
            }
        }
    }
    else if (!this->loop)
    {
        this->SetDataUseCount(this->GetSuccList()->Count());
    }
    else if(this == this->loop->dominatingLoopCountableBlock)
    {
        globOpt->DetermineLoopCount(this->loop);
    }
}